

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndFrame(void)

{
  int *piVar1;
  ImVec2 IVar2;
  ImGuiNavLayer IVar3;
  ImGuiContextHook *pIVar4;
  _func_void_int_int *p_Var5;
  ImGuiViewportP *pIVar6;
  char *__s1;
  ImGuiWindow *pIVar7;
  ImGuiWindow **ppIVar8;
  unsigned_short *puVar9;
  ImGuiContext *pIVar10;
  int iVar11;
  ImGuiContext *pIVar12;
  ImGuiContext *pIVar13;
  byte bVar14;
  ImGuiID key;
  ImVec2 in_RAX;
  ImGuiContext *g_6;
  ImGuiWindow *pIVar15;
  ImGuiWindow **ppIVar16;
  unsigned_short *__dest;
  uint uVar17;
  int iVar18;
  char *pcVar19;
  char *label;
  ImGuiContext *g;
  ImGuiContext *g_1;
  long lVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  bool bVar24;
  uint uVar25;
  uint uVar26;
  float fVar27;
  ImVec2 IVar28;
  ImVec2 IVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  ImVec2 local_38;
  
  pIVar12 = GImGui;
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    local_38 = in_RAX;
    if (0 < (GImGui->Hooks).Size) {
      lVar20 = 0;
      lVar22 = 0;
      do {
        pIVar4 = (pIVar12->Hooks).Data;
        if (*(int *)(pIVar4 + lVar20 + 4) == 2) {
          (**(code **)(pIVar4 + lVar20 + 0x10))(pIVar12);
        }
        lVar22 = lVar22 + 1;
        lVar20 = lVar20 + 0x20;
      } while (lVar22 < (pIVar12->Hooks).Size);
    }
    pIVar10 = GImGui;
    iVar18 = (GImGui->CurrentWindowStack).Size;
    while (1 < iVar18) {
      End();
      iVar18 = (pIVar10->CurrentWindowStack).Size;
    }
    p_Var5 = (pIVar12->IO).ImeSetInputScreenPosFn;
    if (p_Var5 != (_func_void_int_int *)0x0) {
      fVar27 = (pIVar12->PlatformImeLastPos).x;
      if (((fVar27 == 3.4028235e+38) && (!NAN(fVar27))) ||
         (fVar27 = fVar27 - (pIVar12->PlatformImePos).x,
         fVar30 = (pIVar12->PlatformImeLastPos).y - (pIVar12->PlatformImePos).y,
         0.0001 < fVar27 * fVar27 + fVar30 * fVar30)) {
        (*p_Var5)((int)(pIVar12->PlatformImePos).x,(int)(pIVar12->PlatformImePos).y);
        pIVar12->PlatformImeLastPos = pIVar12->PlatformImePos;
      }
    }
    pIVar12->WithinFrameScopeWithImplicitWindow = false;
    pIVar15 = pIVar12->CurrentWindow;
    if ((pIVar15 != (ImGuiWindow *)0x0) && (pIVar15->WriteAccessed == false)) {
      pIVar15->Active = false;
    }
    End();
    pIVar10 = GImGui;
    if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
       (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
      if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
        key = ImHashStr("###NavWindowingList",0,0);
        pIVar15 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&pIVar10->WindowsById,key);
        pIVar10->NavWindowingListWindow = pIVar15;
      }
      pIVar6 = *(pIVar10->Viewports).Data;
      uVar17 = (pIVar10->NextWindowData).Flags;
      (pIVar10->NextWindowData).Flags = uVar17 | 0x10;
      IVar2 = (pIVar6->super_ImGuiViewport).Size;
      IVar28.x = IVar2.x * 0.2;
      IVar28.y = IVar2.y * 0.2;
      (pIVar10->NextWindowData).SizeConstraintRect.Min = IVar28;
      (pIVar10->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
      (pIVar10->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
      (pIVar10->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
      (pIVar10->NextWindowData).SizeCallbackUserData = (void *)0x0;
      IVar2 = (pIVar6->super_ImGuiViewport).Size;
      IVar28 = (pIVar6->super_ImGuiViewport).Pos;
      IVar29.x = IVar2.x * 0.5 + IVar28.x;
      IVar29.y = IVar2.y * 0.5 + IVar28.y;
      (pIVar10->NextWindowData).Flags = uVar17 | 0x11;
      (pIVar10->NextWindowData).PosVal = IVar29;
      (pIVar10->NextWindowData).PosPivotVal.x = 0.5;
      (pIVar10->NextWindowData).PosPivotVal.y = 0.5;
      (pIVar10->NextWindowData).PosCond = 1;
      IVar2 = (pIVar10->Style).WindowPadding;
      fVar30 = IVar2.x;
      fVar27 = IVar2.y;
      local_38.x = fVar30 + fVar30;
      local_38.y = fVar27 + fVar27;
      PushStyleVar(1,&local_38);
      Begin("###NavWindowingList",(bool *)0x0,0xc1347);
      lVar20 = (long)(pIVar10->WindowsFocusOrder).Size;
      if (0 < lVar20) {
        do {
          pIVar15 = (pIVar10->WindowsFocusOrder).Data[lVar20 + -1];
          if (((pIVar15->WasActive == true) && (pIVar15->RootWindow == pIVar15)) &&
             (uVar17 = pIVar15->Flags, (uVar17 >> 0x13 & 1) == 0)) {
            __s1 = pIVar15->Name;
            pcVar19 = __s1;
            if (__s1 != (char *)0xffffffffffffffff) {
              do {
                if (*pcVar19 == '#') {
                  if (pcVar19[1] == '#') goto LAB_0011f547;
                }
                else if (*pcVar19 == '\0') goto LAB_0011f547;
                pcVar19 = pcVar19 + 1;
              } while (pcVar19 != (char *)0xffffffffffffffff);
              pcVar19 = (char *)0xffffffffffffffff;
            }
LAB_0011f547:
            label = __s1;
            if ((__s1 == pcVar19) && (label = "(Popup)", (uVar17 >> 0x1a & 1) == 0)) {
              if ((uVar17 >> 10 & 1) != 0) {
                iVar18 = strcmp(__s1,"##MainMenuBar");
                label = "(Main menu bar)";
                if (iVar18 == 0) goto LAB_0011f582;
              }
              label = "(Untitled)";
            }
LAB_0011f582:
            local_38.x = 0.0;
            local_38.y = 0.0;
            Selectable(label,pIVar10->NavWindowingTarget == pIVar15,0,&local_38);
          }
          bVar24 = 1 < lVar20;
          lVar20 = lVar20 + -1;
        } while (bVar24);
      }
      End();
      PopStyleVar(1);
    }
    pIVar13 = GImGui;
    pIVar15 = pIVar10->NavWrapRequestWindow;
    if (((pIVar15 != (ImGuiWindow *)0x0) && (pIVar10->NavWindow == pIVar15)) &&
       ((GImGui->NavMoveRequest == true &&
        (((((GImGui->NavMoveResultLocal).ID == 0 && ((GImGui->NavMoveResultOther).ID == 0)) &&
          (pIVar10->NavMoveRequestForward == ImGuiNavForward_None)) &&
         (pIVar10->NavLayer == ImGuiNavLayer_Main)))))) {
      uVar17 = pIVar10->NavWrapRequestFlags;
      fVar27 = pIVar15->NavRectRel[0].Min.x;
      fVar30 = pIVar15->NavRectRel[0].Min.y;
      fVar32 = pIVar15->NavRectRel[0].Max.x;
      fVar31 = pIVar15->NavRectRel[0].Max.y;
      uVar25 = pIVar10->NavMoveDir;
      if (uVar25 == 0) {
        if ((uVar17 & 5) == 0) {
          uVar25 = 0;
        }
        else {
          fVar27 = (pIVar15->SizeFull).x;
          fVar32 = (pIVar15->WindowPadding).x;
          fVar32 = fVar32 + fVar32 + (pIVar15->ContentSize).x;
          uVar25 = -(uint)(fVar32 <= fVar27);
          fVar27 = (float)(uVar25 & (uint)fVar27 | ~uVar25 & (uint)fVar32) - (pIVar15->Scroll).x;
          if ((uVar17 & 4) != 0) {
            fVar32 = fVar31 - fVar30;
            fVar30 = fVar30 - fVar32;
            fVar31 = fVar31 - fVar32;
          }
          uVar25 = (uVar17 & 4) >> 1;
          GImGui->NavMoveRequest = false;
          pIVar13->NavAnyRequest = pIVar13->NavInitRequest;
          pIVar13->NavMoveDir = 0;
          pIVar13->NavMoveClipDir = uVar25;
          pIVar13->NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
          pIVar13->NavMoveRequestFlags = uVar17;
          pIVar7 = pIVar13->NavWindow;
          IVar3 = pIVar13->NavLayer;
          pIVar7->NavRectRel[IVar3].Min.x = fVar27;
          pIVar7->NavRectRel[IVar3].Min.y = fVar30;
          pIVar7->NavRectRel[IVar3].Max.x = fVar27;
          pIVar7->NavRectRel[IVar3].Max.y = fVar31;
          fVar32 = fVar27;
        }
      }
      iVar18 = pIVar10->NavMoveDir;
      if ((uVar17 & 5) != 0 && iVar18 == 1) {
        fVar27 = -(pIVar15->Scroll).x;
        if ((uVar17 & 4) != 0) {
          fVar32 = fVar31 - fVar30;
          fVar30 = fVar30 + fVar32;
          fVar31 = fVar31 + fVar32;
          uVar25 = 3;
        }
        pIVar13->NavMoveRequest = false;
        pIVar13->NavAnyRequest = pIVar13->NavInitRequest;
        pIVar13->NavMoveDir = iVar18;
        pIVar13->NavMoveClipDir = uVar25;
        pIVar13->NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
        pIVar13->NavMoveRequestFlags = uVar17;
        pIVar7 = pIVar13->NavWindow;
        IVar3 = pIVar13->NavLayer;
        pIVar7->NavRectRel[IVar3].Min.x = fVar27;
        pIVar7->NavRectRel[IVar3].Min.y = fVar30;
        pIVar7->NavRectRel[IVar3].Max.x = fVar27;
        pIVar7->NavRectRel[IVar3].Max.y = fVar31;
        fVar32 = fVar27;
      }
      iVar18 = pIVar10->NavMoveDir;
      if ((uVar17 & 10) != 0 && iVar18 == 2) {
        fVar30 = (pIVar15->SizeFull).y;
        fVar31 = (pIVar15->WindowPadding).y;
        fVar31 = fVar31 + fVar31 + (pIVar15->ContentSize).y;
        uVar26 = -(uint)(fVar31 <= fVar30);
        fVar30 = (float)(uVar26 & (uint)fVar30 | ~uVar26 & (uint)fVar31) - (pIVar15->Scroll).y;
        bVar24 = (uVar17 & 8) != 0;
        if (bVar24) {
          fVar31 = fVar32 - fVar27;
          fVar27 = fVar27 - fVar31;
          fVar32 = fVar32 - fVar31;
        }
        if (bVar24) {
          uVar25 = 0;
        }
        pIVar13->NavMoveRequest = false;
        pIVar13->NavAnyRequest = pIVar13->NavInitRequest;
        pIVar13->NavMoveDir = iVar18;
        pIVar13->NavMoveClipDir = uVar25;
        pIVar13->NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
        pIVar13->NavMoveRequestFlags = uVar17;
        pIVar7 = pIVar13->NavWindow;
        IVar3 = pIVar13->NavLayer;
        pIVar7->NavRectRel[IVar3].Min.x = fVar27;
        pIVar7->NavRectRel[IVar3].Min.y = fVar30;
        pIVar7->NavRectRel[IVar3].Max.x = fVar32;
        pIVar7->NavRectRel[IVar3].Max.y = fVar30;
      }
      iVar18 = pIVar10->NavMoveDir;
      if (iVar18 == 3 && (uVar17 & 10) != 0) {
        fVar30 = -(pIVar15->Scroll).y;
        bVar24 = (uVar17 & 8) != 0;
        if (bVar24) {
          fVar31 = fVar32 - fVar27;
          fVar27 = fVar27 + fVar31;
          fVar32 = fVar32 + fVar31;
        }
        if (bVar24) {
          uVar25 = 1;
        }
        pIVar13->NavMoveRequest = false;
        pIVar13->NavAnyRequest = pIVar13->NavInitRequest;
        pIVar13->NavMoveDir = iVar18;
        pIVar13->NavMoveClipDir = uVar25;
        pIVar13->NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
        pIVar13->NavMoveRequestFlags = uVar17;
        pIVar15 = pIVar13->NavWindow;
        IVar3 = pIVar13->NavLayer;
        pIVar15->NavRectRel[IVar3].Min.x = fVar27;
        pIVar15->NavRectRel[IVar3].Min.y = fVar30;
        pIVar15->NavRectRel[IVar3].Max.x = fVar32;
        pIVar15->NavRectRel[IVar3].Max.y = fVar30;
      }
    }
    if (pIVar12->DragDropActive == true) {
      if ((pIVar12->DragDropPayload).DataFrameCount + 1 < pIVar12->FrameCount) {
        bVar14 = 1;
        if ((pIVar12->DragDropSourceFlags & 0x20) == 0) {
          bVar14 = (GImGui->IO).MouseDown[pIVar12->DragDropMouseButton] ^ 1;
        }
      }
      else {
        bVar14 = 0;
      }
      if ((bVar14 != 0) || ((pIVar12->DragDropPayload).Delivery != false)) {
        ClearDragDrop();
      }
    }
    if (((pIVar12->DragDropActive == true) &&
        (pIVar12->DragDropSourceFrameCount < pIVar12->FrameCount)) &&
       ((pIVar12->DragDropSourceFlags & 1) == 0)) {
      pIVar12->DragDropWithinSource = true;
      SetTooltip("...");
      pIVar12->DragDropWithinSource = false;
    }
    pIVar12->WithinFrameScope = false;
    pIVar12->FrameCountEnded = pIVar12->FrameCount;
    UpdateMouseMovingWindowEndFrame();
    iVar18 = (pIVar12->WindowsTempSortBuffer).Capacity;
    if (iVar18 < 0) {
      uVar17 = iVar18 / 2 + iVar18;
      uVar23 = 0;
      if (0 < (int)uVar17) {
        uVar23 = (ulong)uVar17;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar16 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar23 * 8,GImAllocatorUserData);
      ppIVar8 = (pIVar12->WindowsTempSortBuffer).Data;
      if (ppIVar8 != (ImGuiWindow **)0x0) {
        memcpy(ppIVar16,ppIVar8,(long)(pIVar12->WindowsTempSortBuffer).Size << 3);
        ppIVar8 = (pIVar12->WindowsTempSortBuffer).Data;
        if ((ppIVar8 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar8,GImAllocatorUserData);
      }
      (pIVar12->WindowsTempSortBuffer).Data = ppIVar16;
      (pIVar12->WindowsTempSortBuffer).Capacity = (int)uVar23;
    }
    (pIVar12->WindowsTempSortBuffer).Size = 0;
    iVar18 = (pIVar12->Windows).Size;
    if ((pIVar12->WindowsTempSortBuffer).Capacity < iVar18) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      ppIVar16 = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar18 << 3,GImAllocatorUserData);
      ppIVar8 = (pIVar12->WindowsTempSortBuffer).Data;
      if (ppIVar8 != (ImGuiWindow **)0x0) {
        memcpy(ppIVar16,ppIVar8,(long)(pIVar12->WindowsTempSortBuffer).Size << 3);
        ppIVar8 = (pIVar12->WindowsTempSortBuffer).Data;
        if ((ppIVar8 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar8,GImAllocatorUserData);
      }
      (pIVar12->WindowsTempSortBuffer).Data = ppIVar16;
      (pIVar12->WindowsTempSortBuffer).Capacity = iVar18;
    }
    uVar17 = (pIVar12->Windows).Size;
    if (uVar17 != 0) {
      uVar23 = 0;
      do {
        pIVar15 = (pIVar12->Windows).Data[uVar23];
        if ((pIVar15->Active != true) || ((pIVar15->Flags & 0x1000000) == 0)) {
          AddWindowToSortBuffer(&pIVar12->WindowsTempSortBuffer,pIVar15);
        }
        uVar23 = uVar23 + 1;
        uVar17 = (pIVar12->Windows).Size;
      } while (uVar23 != uVar17);
    }
    iVar18 = (pIVar12->Windows).Capacity;
    iVar21 = (pIVar12->WindowsTempSortBuffer).Size;
    iVar11 = (pIVar12->WindowsTempSortBuffer).Capacity;
    ppIVar16 = (pIVar12->WindowsTempSortBuffer).Data;
    (pIVar12->WindowsTempSortBuffer).Size = uVar17;
    (pIVar12->WindowsTempSortBuffer).Capacity = iVar18;
    ppIVar8 = (pIVar12->Windows).Data;
    (pIVar12->Windows).Size = iVar21;
    (pIVar12->Windows).Capacity = iVar11;
    (pIVar12->Windows).Data = ppIVar16;
    (pIVar12->WindowsTempSortBuffer).Data = ppIVar8;
    (pIVar12->IO).MetricsActiveWindows = pIVar12->WindowsActiveCount;
    ((pIVar12->IO).Fonts)->Locked = false;
    (pIVar12->IO).MouseWheel = 0.0;
    (pIVar12->IO).MouseWheelH = 0.0;
    iVar18 = (pIVar12->IO).InputQueueCharacters.Capacity;
    if (iVar18 < 0) {
      iVar18 = iVar18 / 2 + iVar18;
      iVar21 = 0;
      if (0 < iVar18) {
        iVar21 = iVar18;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (unsigned_short *)
               (*GImAllocatorAllocFunc)((ulong)(uint)(iVar21 * 2),GImAllocatorUserData);
      puVar9 = (pIVar12->IO).InputQueueCharacters.Data;
      if (puVar9 != (unsigned_short *)0x0) {
        memcpy(__dest,puVar9,(long)(pIVar12->IO).InputQueueCharacters.Size * 2);
        puVar9 = (pIVar12->IO).InputQueueCharacters.Data;
        if ((puVar9 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar9,GImAllocatorUserData);
      }
      (pIVar12->IO).InputQueueCharacters.Data = __dest;
      (pIVar12->IO).InputQueueCharacters.Capacity = iVar21;
    }
    (pIVar12->IO).InputQueueCharacters.Size = 0;
    (pIVar12->IO).NavInputs[0] = 0.0;
    (pIVar12->IO).NavInputs[1] = 0.0;
    (pIVar12->IO).NavInputs[2] = 0.0;
    (pIVar12->IO).NavInputs[3] = 0.0;
    (pIVar12->IO).NavInputs[4] = 0.0;
    (pIVar12->IO).NavInputs[5] = 0.0;
    (pIVar12->IO).NavInputs[6] = 0.0;
    (pIVar12->IO).NavInputs[7] = 0.0;
    (pIVar12->IO).NavInputs[8] = 0.0;
    (pIVar12->IO).NavInputs[9] = 0.0;
    (pIVar12->IO).NavInputs[10] = 0.0;
    (pIVar12->IO).NavInputs[0xb] = 0.0;
    (pIVar12->IO).NavInputs[0xc] = 0.0;
    (pIVar12->IO).NavInputs[0xd] = 0.0;
    (pIVar12->IO).NavInputs[0xe] = 0.0;
    (pIVar12->IO).NavInputs[0xf] = 0.0;
    (pIVar12->IO).NavInputs[0x10] = 0.0;
    (pIVar12->IO).NavInputs[0x11] = 0.0;
    (pIVar12->IO).NavInputs[0x12] = 0.0;
    (pIVar12->IO).NavInputs[0x13] = 0.0;
    (pIVar12->IO).NavInputs[0x14] = 0.0;
    if (0 < (pIVar12->Hooks).Size) {
      lVar20 = 0;
      lVar22 = 0;
      do {
        pIVar4 = (pIVar12->Hooks).Data;
        if (*(int *)(pIVar4 + lVar20 + 4) == 3) {
          (**(code **)(pIVar4 + lVar20 + 0x10))(pIVar12,pIVar4 + lVar20);
        }
        lVar22 = lVar22 + 1;
        lVar20 = lVar20 + 0x20;
      } while (lVar22 < (pIVar12->Hooks).Size);
    }
  }
  return;
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f))
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}